

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

SimpleString __thiscall UtestShell::getFormattedName(UtestShell *this)

{
  size_t extraout_RDX;
  long *in_RSI;
  char *in_RDI;
  SimpleString SVar1;
  SimpleString *formattedName;
  char *in_stack_ffffffffffffffd8;
  SimpleString *in_stack_ffffffffffffffe0;
  
  (**(code **)(*in_RSI + 0x140))();
  SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = in_RDI;
  return SVar1;
}

Assistant:

SimpleString UtestShell::getFormattedName() const
{
    SimpleString formattedName(getMacroName());
    formattedName += "(";
    formattedName += group_;
    formattedName += ", ";
    formattedName += name_;
    formattedName += ")";

    return formattedName;
}